

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall dxil_spv::Converter::Impl::get_type_id(Impl *this,Type *type,TypeLayoutFlags flags)

{
  pointer pAVar1;
  TypeID TVar2;
  Id type_id;
  uint uVar3;
  Id IVar4;
  uint uVar5;
  Id id;
  Builder *this_00;
  uint64_t uVar6;
  StructType *this_01;
  VectorType *this_02;
  Type *pTVar7;
  SizeAlignment SVar8;
  LoggingCallback p_Var9;
  void *pvVar10;
  pointer pAVar11;
  uint i;
  int iStack_1050;
  Id local_103c;
  Vector<spv::Id> member_types;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  TVar2 = LLVMBC::Type::getTypeID(type);
  IVar4 = 0;
  switch(TVar2) {
  case HalfTyID:
    iStack_1050 = ((byte)~((this->options).min_precision_prefer_native_16bit |
                          (this->execution_mode_meta).native_16bit_operations) & 1) * 0x10 + 0x10;
    break;
  case FloatTyID:
    iStack_1050 = 0x20;
    break;
  case DoubleTyID:
    iStack_1050 = 0x40;
    break;
  case IntegerTyID:
    uVar5 = LLVMBC::Type::getIntegerBitWidth(type);
    if (uVar5 != 1) {
      uVar5 = LLVMBC::Type::getIntegerBitWidth(type);
      uVar5 = physical_integer_bit_width(uVar5);
      IVar4 = spv::Builder::makeIntegerType(this_00,uVar5,false);
      return IVar4;
    }
    IVar4 = spv::Builder::makeBoolType(this_00);
    return IVar4;
  case PointerTyID:
    uVar5 = LLVMBC::Type::getPointerAddressSpace(type);
    if (((flags & 1) != 0) && ((uVar5 & 0xff) == 6)) {
      pTVar7 = LLVMBC::Type::getPointerElementType(type);
      IVar4 = get_type_id(this,pTVar7,flags);
      IVar4 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar4);
      return IVar4;
    }
    p_Var9 = get_thread_log_callback();
    if (p_Var9 != (LoggingCallback)0x0) {
      memcpy(&member_types,
             "Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n"
             ,0x62);
      pvVar10 = get_thread_log_callback_userdata();
      (*p_Var9)(pvVar10,Error,(char *)&member_types);
      std::terminate();
    }
    fwrite("[ERROR]: Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n"
           ,0x6a,1,_stderr);
    fflush(_stderr);
    std::terminate();
  case ArrayTyID:
    uVar6 = LLVMBC::Type::getArrayNumElements(type);
    if (uVar6 == 0) {
      return 0;
    }
    if ((flags & 1) == 0) {
      pTVar7 = LLVMBC::Type::getArrayElementType(type);
      TVar2 = LLVMBC::Type::getTypeID(pTVar7);
      if (TVar2 == IntegerTyID) {
        pTVar7 = LLVMBC::Type::getArrayElementType(type);
        uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar7);
        if ((uVar5 == 8) && (uVar6 = LLVMBC::Type::getArrayNumElements(type), (uVar6 & 3) == 0)) {
          uVar6 = LLVMBC::Type::getArrayNumElements(type);
          IVar4 = spv::Builder::makeUintConstant(this_00,(uint)(uVar6 >> 2),false);
          type_id = spv::Builder::makeUintType(this_00,0x20);
          goto LAB_0011539c;
        }
      }
    }
    uVar6 = LLVMBC::Type::getArrayNumElements(type);
    IVar4 = spv::Builder::makeUintConstant(this_00,(uint)uVar6,false);
    pTVar7 = LLVMBC::Type::getArrayElementType(type);
    type_id = get_type_id(this,pTVar7,flags & 0xfffffff7);
    if ((flags & 1) != 0) {
      SVar8 = get_physical_size_for_type(this,type_id);
      pAVar1 = (this->cached_physical_array_types).
               super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar11 = pAVar1;
        if (pAVar11 ==
            (this->cached_physical_array_types).
            super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          id = spv::Builder::makeArrayType(this_00,type_id,IVar4,SVar8.size);
          spv::Builder::addDecoration(this_00,id,DecorationArrayStride,SVar8.size);
          member_types.
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(type_id,id);
          member_types.
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(member_types.
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,IVar4);
          std::
          vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
          ::emplace_back<dxil_spv::Converter::Impl::ArrayTypeEntry>
                    (&this->cached_physical_array_types,(ArrayTypeEntry *)&member_types);
          return id;
        }
        pAVar1 = pAVar11 + 1;
      } while ((pAVar11->element_type_id != type_id) || (pAVar11->array_size_id != IVar4));
      return pAVar11->id;
    }
LAB_0011539c:
    IVar4 = spv::Builder::makeArrayType(this_00,type_id,IVar4,0);
    return IVar4;
  case StructTyID:
    this_01 = LLVMBC::cast<LLVMBC::StructType>(type);
    member_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    member_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    member_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
              (&member_types,(ulong)uVar5);
    for (uVar5 = 0; uVar3 = LLVMBC::Type::getStructNumElements(&this_01->super_Type), uVar5 < uVar3;
        uVar5 = uVar5 + 1) {
      pTVar7 = LLVMBC::Type::getStructElementType(&this_01->super_Type,uVar5);
      local_103c = get_type_id(this,pTVar7,flags & 0xfffffff7);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
      emplace_back<unsigned_int>(&member_types,&local_103c);
    }
    IVar4 = get_struct_type(this,(Vector<spv::Id> *)
                                 &member_types.
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ,flags,"");
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&member_types.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  default:
    return IVar4;
  case VectorTyID:
    this_02 = LLVMBC::cast<LLVMBC::VectorType>(type);
    pTVar7 = LLVMBC::VectorType::getElementType(this_02);
    IVar4 = get_type_id(this,pTVar7,0);
    uVar5 = LLVMBC::Type::getVectorNumElements(&this_02->super_Type);
    IVar4 = spv::Builder::makeVectorType(this_00,IVar4,uVar5);
    return IVar4;
  }
  IVar4 = spv::Builder::makeFloatType(this_00,iStack_1050);
  return IVar4;
}

Assistant:

spv::Id Converter::Impl::get_type_id(const llvm::Type *type, TypeLayoutFlags flags)
{
	auto &builder = spirv_module.get_builder();
	switch (type->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		return builder.makeFloatType(support_native_fp16_operations() ? 16 : 32);
	case llvm::Type::TypeID::FloatTyID:
		return builder.makeFloatType(32);
	case llvm::Type::TypeID::DoubleTyID:
		return builder.makeFloatType(64);

	case llvm::Type::TypeID::IntegerTyID:
		if (type->getIntegerBitWidth() == 1)
			return builder.makeBoolType();
		else
		{
			auto width = physical_integer_bit_width(type->getIntegerBitWidth());
			return builder.makeIntegerType(width, false);
		}

	case llvm::Type::TypeID::PointerTyID:
	{
		if (DXIL::AddressSpace(type->getPointerAddressSpace()) != DXIL::AddressSpace::PhysicalNodeIO ||
		    (flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0)
		{
			// Have to deal with this from the outside. Should only be relevant for getelementptr and instructions like that.
			LOGE("Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n");
			std::terminate();
		}

		// This is free-flowing BDA in DXIL. We'll deal with it as-is.
		// Main complication is that we have to emit Offset information ourselves.
		spv::Id pointee_type = get_type_id(type->getPointerElementType(), flags);
		return builder.makePointer(spv::StorageClassPhysicalStorageBuffer, pointee_type);
	}

	case llvm::Type::TypeID::ArrayTyID:
	{
		if (type->getArrayNumElements() == 0)
			return 0;

		spv::Id array_size_id;
		spv::Id element_type_id;

		// dxbc2dxil emits broken code for TGSM. It's an array of i8 which is absolute nonsense.
		// It then bitcasts the pointer to i32, which isn't legal either.
		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0 &&
		    type->getArrayElementType()->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		    type->getArrayElementType()->getIntegerBitWidth() == 8 &&
		    type->getArrayNumElements() % 4 == 0)
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements() / 4);
			element_type_id = builder.makeUintType(32);
		}
		else
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements());
			element_type_id = get_type_id(type->getArrayElementType(), flags & ~TYPE_LAYOUT_BLOCK_BIT);
		}

		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
		{
			auto size_stride = get_physical_size_for_type(element_type_id);
			uint32_t stride = size_stride.size;

			// We always use scalar layout.
			for (auto &cached_type : cached_physical_array_types)
				if (cached_type.element_type_id == element_type_id && cached_type.array_size_id == array_size_id)
					return cached_type.id;

			spv::Id array_type_id = builder.makeArrayType(element_type_id, array_size_id, stride);
			builder.addDecoration(array_type_id, spv::DecorationArrayStride, stride);
			cached_physical_array_types.push_back({ array_type_id, element_type_id, array_size_id });
			return array_type_id;
		}
		else
		{
			// glslang emitter deduplicates.
			return builder.makeArrayType(element_type_id, array_size_id, 0);
		}
	}

	case llvm::Type::TypeID::StructTyID:
	{
		auto *struct_type = llvm::cast<llvm::StructType>(type);
		Vector<spv::Id> member_types;
		member_types.reserve(struct_type->getStructNumElements());
		for (unsigned i = 0; i < struct_type->getStructNumElements(); i++)
			member_types.push_back(get_type_id(struct_type->getStructElementType(i), flags & ~TYPE_LAYOUT_BLOCK_BIT));
		return get_struct_type(member_types, flags, "");
	}

	case llvm::Type::TypeID::VectorTyID:
	{
		auto *vec_type = llvm::cast<llvm::VectorType>(type);
		return builder.makeVectorType(get_type_id(vec_type->getElementType()), vec_type->getVectorNumElements());
	}

	default:
		return 0;
	}
}